

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O0

ircode_t * ircode_create(uint16_t nlocals)

{
  code_r *pcVar1;
  uint local_24;
  uint32_t i;
  ircode_t *code;
  ircode_t *piStack_10;
  uint16_t nlocals_local;
  
  piStack_10 = (ircode_t *)gravity_calloc((gravity_vm *)0x0,1,0x290);
  if (piStack_10 == (ircode_t *)0x0) {
    piStack_10 = (ircode_t *)0x0;
  }
  else {
    piStack_10->label_counter = 0;
    piStack_10->nlocals = nlocals;
    piStack_10->ntemps = 0;
    piStack_10->maxtemp = 0;
    piStack_10->error = false;
    pcVar1 = (code_r *)gravity_calloc((gravity_vm *)0x0,1,0x18);
    piStack_10->list = pcVar1;
    if (piStack_10->list == (code_r *)0x0) {
      free(piStack_10);
      piStack_10 = (ircode_t *)0x0;
    }
    else {
      piStack_10->list->m = 0;
      piStack_10->list->n = 0;
      piStack_10->list->p = (inst_t **)0x0;
      (piStack_10->label_true).m = 0;
      (piStack_10->label_true).n = 0;
      (piStack_10->label_true).p = (uint32_t *)0x0;
      (piStack_10->label_false).m = 0;
      (piStack_10->label_false).n = 0;
      (piStack_10->label_false).p = (uint32_t *)0x0;
      (piStack_10->label_check).m = 0;
      (piStack_10->label_check).n = 0;
      (piStack_10->label_check).p = (uint32_t *)0x0;
      (piStack_10->registers).m = 0;
      (piStack_10->registers).n = 0;
      (piStack_10->registers).p = (uint32_t *)0x0;
      (piStack_10->context).m = 0;
      (piStack_10->context).n = 0;
      (piStack_10->context).p = (_Bool **)0x0;
      memset(piStack_10->state,0,0x100);
      piStack_10->state[0] = true;
      for (local_24 = 0; local_24 < nlocals; local_24 = local_24 + 1) {
        piStack_10->state[local_24] = true;
      }
    }
  }
  return piStack_10;
}

Assistant:

ircode_t *ircode_create (uint16_t nlocals) {
    ircode_t *code = (ircode_t *)mem_alloc(NULL, sizeof(ircode_t));
    if (!code) return NULL;
    code->label_counter = 0;
    code->nlocals = nlocals;
    code->ntemps = 0;
    code->maxtemp = 0;
    code->error = false;

    code->list = mem_alloc(NULL, sizeof(code_r));
    if (!code->list) {
        mem_free(code);
        return NULL;
    }
    marray_init(*code->list);
    marray_init(code->label_true);
    marray_init(code->label_false);
    marray_init(code->label_check);
    marray_init(code->registers);
    marray_init(code->context);

    // init state array (register 0 is reserved)
    bzero(code->state, MAX_REGISTERS * sizeof(bool));
    code->state[0] = true;
    for (uint32_t i=0; i<nlocals; ++i) {
        code->state[i] = true;
    }
    return code;
}